

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::EventTriggerStatementSyntax::setChild
          (EventTriggerStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0022fbe4 + *(int *)(&DAT_0022fbe4 + index * 4)))();
  return;
}

Assistant:

void EventTriggerStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: trigger = child.token(); return;
        case 3: timing = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 4: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}